

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::EHBailoutPatchUp(Lowerer *this)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  LabelInstr *restoreLabel;
  Instr *pIVar5;
  LabelInstr *pLVar6;
  BailOutInfo *pBVar7;
  Region *pRVar8;
  Func *func;
  Region *region;
  Instr *this_00;
  LabelInstr *local_38;
  
  func = this->m_func;
  if ((func->field_0x243 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x57df,"(this->m_func->isPostLayout)","this->m_func->isPostLayout");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    func = this->m_func;
  }
  restoreLabel = IR::LabelInstr::New(Label,func,false);
  pIVar5 = IR::Instr::GetPrevRealInstrOrLabel(this->m_func->m_exitInstr);
  if ((pIVar5->m_kind == InstrKindProfiledLabel) || (pIVar5->m_kind == InstrKindLabel)) {
    local_38 = IR::Instr::AsLabelInstr(pIVar5);
  }
  else {
    local_38 = IR::LabelInstr::New(Label,this->m_func,false);
    IR::Instr::InsertBefore(this->m_func->m_exitInstr,&local_38->super_Instr);
  }
  pIVar5 = this->m_func->m_headInstr;
  bVar3 = false;
LAB_0057f442:
  do {
    do {
      this_00 = pIVar5;
      if (this_00 == (Instr *)0x0) {
        return;
      }
      pIVar5 = this_00->m_next;
      if ((this_00->m_kind == InstrKindLabel) || (this_00->m_kind == InstrKindProfiledLabel)) {
        pLVar6 = IR::Instr::AsLabelInstr(this_00);
        region = pLVar6->m_region;
        this->currentRegion = region;
      }
      else {
        region = this->currentRegion;
      }
    } while ((region == (Region *)0x0) || (2 < (byte)(region->type - RegionTypeTry)));
    if ((region->type == RegionTypeFinally) &&
       (pRVar8 = region, region->matchingTryRegion->matchingFinallyOnNoExceptRegion == region)) {
      do {
        pRVar8 = pRVar8->parent;
        if (pRVar8->type != RegionTypeFinally) {
          if (pRVar8->type == RegionTypeRoot) goto LAB_0057f442;
          break;
        }
      } while (pRVar8->matchingTryRegion->matchingFinallyOnNoExceptRegion == pRVar8);
    }
    InsertReturnThunkForRegion(this,region,restoreLabel);
    if ((this_00->field_0x38 & 0x10) != 0) {
      pBVar7 = IR::Instr::GetBailOutInfo(this_00);
      if (pBVar7->bailOutFunc == this->m_func) {
        SetHasBailedOut(this,this_00);
      }
      EmitEHBailoutStackRestore(this,this_00);
      EmitSaveEHBailoutReturnValueAndJumpToRetThunk(this,this_00);
      bVar2 = !bVar3;
      bVar3 = true;
      if (bVar2) {
        EmitRestoreReturnValueFromEHBailout(this,restoreLabel,local_38);
        bVar3 = true;
      }
    }
  } while( true );
}

Assistant:

void
Lowerer::EHBailoutPatchUp()
{
    Assert(this->m_func->isPostLayout);
    // 1. Insert return thunks for all the regions.
    // 2. Set the hasBailedOut bit to true on all bailout paths in EH regions.
    // 3. Insert code after every bailout in a try or catch region to save the return value on the stack, and jump to the return thunk (See Region.h) of that region.
    // 4. Insert code right before the epilog, to restore the return value (saved in 2.) from a bailout into eax.

    IR::LabelInstr * restoreReturnValueFromBailoutLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

    IR::LabelInstr * epilogLabel;
    IR::Instr * exitPrevInstr = this->m_func->m_exitInstr->GetPrevRealInstrOrLabel();
    if (exitPrevInstr->IsLabelInstr())
    {
        epilogLabel = exitPrevInstr->AsLabelInstr();
    }
    else
    {
        epilogLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        this->m_func->m_exitInstr->InsertBefore(epilogLabel);
    }

    IR::Instr * tmpInstr = nullptr;
    bool restoreReturnFromBailoutEmitted = false;
    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->m_func)
    {
        if (instr->IsLabelInstr())
        {
            this->currentRegion = instr->AsLabelInstr()->GetRegion();
        }

        // Consider (radua): Assert(this->currentRegion) here?
        if (this->currentRegion)
        {
            RegionType currentRegionType = this->currentRegion->GetType();
            if (currentRegionType == RegionTypeTry || currentRegionType == RegionTypeCatch || currentRegionType == RegionTypeFinally)
            {
                if (this->currentRegion->IsNonExceptingFinally())
                {
                    Region * parent = this->currentRegion->GetParent();

                    while (parent->IsNonExceptingFinally())
                    {
                        parent = parent->GetParent();
                    }
                    if (parent->GetType() == RegionTypeRoot)
                    {
                        continue;
                    }
                }
                this->InsertReturnThunkForRegion(this->currentRegion, restoreReturnValueFromBailoutLabel);
                if (instr->HasBailOutInfo())
                {
                    if (instr->GetBailOutInfo()->bailOutFunc == this->m_func)
                    {
                        // We dont set this bit for inlined code, if there was a bailout in the inlined code,
                        // and an exception was thrown, we want the caller's handler to handle the exception accordingly.
                        // TODO : Revisit when we start inlining functions with try-catch/try-finally
                        this->SetHasBailedOut(instr);
                    }
                    tmpInstr = this->EmitEHBailoutStackRestore(instr);
                    this->EmitSaveEHBailoutReturnValueAndJumpToRetThunk(tmpInstr);
                    if (!restoreReturnFromBailoutEmitted)
                    {
                        this->EmitRestoreReturnValueFromEHBailout(restoreReturnValueFromBailoutLabel, epilogLabel);
                        restoreReturnFromBailoutEmitted = true;
                    }
                }
            }
        }
    }
    NEXT_INSTR_IN_FUNC_EDITING
}